

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

int select_resize(selectop *sop,int fdsz)

{
  fd_set *pfVar1;
  fd_set *writeset_in;
  fd_set *readset_in;
  int fdsz_local;
  selectop *sop_local;
  
  pfVar1 = (fd_set *)event_mm_realloc_(sop->event_readset_in,(long)fdsz);
  if (pfVar1 != (fd_set *)0x0) {
    sop->event_readset_in = pfVar1;
    pfVar1 = (fd_set *)event_mm_realloc_(sop->event_writeset_in,(long)fdsz);
    if (pfVar1 != (fd_set *)0x0) {
      sop->event_writeset_in = pfVar1;
      sop->resize_out_sets = 1;
      memset((void *)((long)sop->event_readset_in->fds_bits + (long)sop->event_fdsz),0,
             (long)(fdsz - sop->event_fdsz));
      memset((void *)((long)sop->event_writeset_in->fds_bits + (long)sop->event_fdsz),0,
             (long)(fdsz - sop->event_fdsz));
      sop->event_fdsz = fdsz;
      return 0;
    }
  }
  event_warn("malloc");
  return -1;
}

Assistant:

static int
select_resize(struct selectop *sop, int fdsz)
{
	fd_set *readset_in = NULL;
	fd_set *writeset_in = NULL;

	if (sop->event_readset_in)
		check_selectop(sop);

	if ((readset_in = mm_realloc(sop->event_readset_in, fdsz)) == NULL)
		goto error;
	sop->event_readset_in = readset_in;
	if ((writeset_in = mm_realloc(sop->event_writeset_in, fdsz)) == NULL) {
		/* Note that this will leave event_readset_in expanded.
		 * That's okay; we wouldn't want to free it, since that would
		 * change the semantics of select_resize from "expand the
		 * readset_in and writeset_in, or return -1" to "expand the
		 * *set_in members, or trash them and return -1."
		 */
		goto error;
	}
	sop->event_writeset_in = writeset_in;
	sop->resize_out_sets = 1;

	memset((char *)sop->event_readset_in + sop->event_fdsz, 0,
	    fdsz - sop->event_fdsz);
	memset((char *)sop->event_writeset_in + sop->event_fdsz, 0,
	    fdsz - sop->event_fdsz);

	sop->event_fdsz = fdsz;
	check_selectop(sop);

	return (0);

 error:
	event_warn("malloc");
	return (-1);
}